

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.hpp
# Opt level: O2

Display * lambda::operator<<(Display *display,
                            optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *value)

{
  Maybe<std::__cxx11::basic_string<char>_> *maybe;
  string sStack_58;
  _Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_38;
  
  std::experimental::fundamentals_v1::
  _Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  ::_Optional_base(&local_38,
                   &value->
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  );
  show<std::__cxx11::string>(&sStack_58,(lambda *)&local_38,maybe);
  std::operator<<((ostream *)&std::cout,(string *)&sStack_58);
  std::__cxx11::string::~string((string *)&sStack_58);
  std::experimental::fundamentals_v1::
  _Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  ::~_Optional_base(&local_38);
  return display;
}

Assistant:

Display &operator<<(Display &display, const T value) {
    display << show(value);
    return display;
}